

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_idate(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  jx9_value *pjVar4;
  uint uVar5;
  int iVar6;
  byte *pbVar7;
  tm *ptVar8;
  int iVar9;
  ulong uVar10;
  time_t t;
  int nLen;
  anon_union_8_3_18420de5_for_x local_38;
  int local_2c;
  
  uVar10 = 0xffffffffffffffff;
  if ((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) goto LAB_00134bfc;
  pbVar7 = (byte *)jx9_value_to_string(*apArg,&local_2c);
  if (local_2c < 1) {
    pjVar4 = pCtx->pRet;
    jx9MemObjRelease(pjVar4);
    (pjVar4->x).iVal = -1;
    pjVar4->iFlags = pjVar4->iFlags & 0xfffffe90U | 2;
  }
  if (nArg == 1) {
    time(&local_38.iVal);
  }
  else {
    pjVar4 = apArg[1];
    if ((pjVar4->iFlags & 2) != 0) {
      jx9MemObjToInteger(pjVar4);
      local_38 = pjVar4->x;
      ptVar8 = localtime(&local_38.iVal);
      if (ptVar8 != (tm *)0x0) goto LAB_00134cad;
    }
    time(&local_38.iVal);
  }
LAB_00134cad:
  ptVar8 = localtime(&local_38.iVal);
  iVar9 = ptVar8->tm_hour;
  iVar2 = ptVar8->tm_mon;
  uVar3 = ptVar8->tm_year;
  iVar6 = uVar3 + 0x76c;
  bVar1 = *pbVar7;
  if (bVar1 < 100) {
    if (0x54 < bVar1) {
      switch(bVar1) {
      case 0x55:
        uVar10 = time((time_t *)0x0);
        break;
      default:
        goto switchD_00134d02_caseD_56;
      case 0x57:
        uVar10 = (ulong)aISO8601[ptVar8->tm_wday % 7];
        break;
      case 0x59:
        goto switchD_00134d02_caseD_59;
      case 0x5a:
        goto switchD_00134d02_caseD_5a;
      }
      goto LAB_00134bfc;
    }
    if (bVar1 == 0x48) {
      uVar10 = (ulong)iVar9;
      goto LAB_00134bfc;
    }
    if (bVar1 == 0x49) {
      uVar10 = (ulong)ptVar8->tm_isdst;
      goto LAB_00134bfc;
    }
    if (bVar1 != 0x4c) goto switchD_00134d02_caseD_56;
    uVar5 = iVar6 * -0x3d70a3d7 + 0x51eb850;
    if ((uVar5 >> 4 | iVar6 * -0x70000000) < 0xa3d70b) {
      uVar10 = 1;
      goto LAB_00134bfc;
    }
    if (0x28f5c28 < (uVar5 >> 2 | uVar3 * 0x40000000)) {
      uVar10 = (ulong)((uVar3 & 3) == 0);
      goto LAB_00134bfc;
    }
    goto switchD_00134d02_caseD_5a;
  }
  switch(bVar1) {
  case 0x68:
    iVar6 = (((uint)(iVar9 / 6 + (iVar9 >> 0x1f)) >> 1) - (iVar9 >> 0x1f)) * -0xc + iVar9 + 1;
    goto switchD_00134d02_caseD_59;
  case 0x69:
    uVar10 = (ulong)ptVar8->tm_min;
    break;
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x75:
  case 0x76:
  case 0x78:
    goto switchD_00134d02_caseD_56;
  case 0x6d:
    uVar10 = (ulong)iVar2;
    break;
  case 0x73:
    uVar10 = (ulong)ptVar8->tm_sec;
    break;
  case 0x74:
    iVar9 = DateFormat::aMonDays
            [(int)(iVar2 + (((uint)(iVar2 / 6 + (iVar2 >> 0x1f)) >> 1) - (iVar2 >> 0x1f)) * -0xc)];
    if ((iVar2 == 1) && (iVar6 != (iVar6 / 400) * 400)) {
      if ((uVar3 & 3) != 0) {
        iVar9 = 0x1c;
      }
      if ((iVar6 * -0x3d70a3d7 + 0x51eb850U >> 2 | uVar3 * 0x40000000) < 0x28f5c29) {
        iVar9 = 0x1c;
      }
    }
    uVar10 = (ulong)iVar9;
    break;
  case 0x77:
    uVar10 = (ulong)ptVar8->tm_wday;
    break;
  case 0x79:
    iVar6 = iVar6 % 100;
switchD_00134d02_caseD_59:
    uVar10 = (ulong)iVar6;
    break;
  case 0x7a:
    uVar10 = (ulong)ptVar8->tm_yday;
    break;
  default:
    if (bVar1 == 100) {
      uVar10 = (ulong)ptVar8->tm_mday;
      break;
    }
    goto switchD_00134d02_caseD_56;
  }
LAB_00134bfc:
  pjVar4 = pCtx->pRet;
  jx9MemObjRelease(pjVar4);
  (pjVar4->x).iVal = uVar10;
  pjVar4->iFlags = pjVar4->iFlags & 0xfffffe90U | 2;
  return 0;
switchD_00134d02_caseD_56:
  jx9VmThrowError(pCtx->pVm,&pCtx->pFunc->sName,2,"Unknown date format token");
switchD_00134d02_caseD_5a:
  uVar10 = 0;
  goto LAB_00134bfc;
}

Assistant:

static int jx9Builtin_idate(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zFormat;
	jx9_int64 iVal = 0;
	int nLen;
	Sytm sTm;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid argument, return -1 */
		jx9_result_int(pCtx, -1);
		return JX9_OK;
	}
	zFormat = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Don't bother processing return -1*/
		jx9_result_int(pCtx, -1);
	}
	if( nArg < 2 ){
#ifdef __WINNT__
		SYSTEMTIME sOS;
		GetSystemTime(&sOS);
		SYSTEMTIME_TO_SYTM(&sOS, &sTm);
#else
		struct tm *pTm;
		time_t t;
		time(&t);
		pTm = localtime(&t);
		STRUCT_TM_TO_SYTM(pTm, &sTm);
#endif
	}else{
		/* Use the given timestamp */
		time_t t;
		struct tm *pTm;
		if( jx9_value_is_int(apArg[1]) ){
			t = (time_t)jx9_value_to_int64(apArg[1]);
			pTm = localtime(&t);
			if( pTm == 0 ){
				time(&t);
			}
		}else{
			time(&t);
		}
		pTm = localtime(&t);
		STRUCT_TM_TO_SYTM(pTm, &sTm);
	}
	/* Perform the requested operation */
	switch(zFormat[0]){
	case 'd':
		/* Day of the month */
		iVal = sTm.tm_mday;
		break;
	case 'h':
		/*	Hour (12 hour format)*/
		iVal = 1 + (sTm.tm_hour % 12);
		break;
	case 'H':
		/* Hour (24 hour format)*/
		iVal = sTm.tm_hour;
		break;
	case 'i':
		/*Minutes*/
		iVal = sTm.tm_min;
		break;
	case 'I':
		/*	returns 1 if DST is activated, 0 otherwise */
#ifdef __WINNT__
#ifdef _MSC_VER
#ifndef _WIN32_WCE
			_get_daylight(&sTm.tm_isdst);
#endif
#endif
#endif
		iVal = sTm.tm_isdst;
		break;
	case 'L':
		/* 	returns 1 for leap year, 0 otherwise */
		iVal = IS_LEAP_YEAR(sTm.tm_year);
		break;
	case 'm':
		/* Month number*/
		iVal = sTm.tm_mon;
		break;
	case 's':
		/*Seconds*/
		iVal = sTm.tm_sec;
		break;
	case 't':{
		/*Days in current month*/
		static const int aMonDays[] = {31, 29, 31, 30, 31, 30, 31, 31, 30, 31, 30, 31 };
		int nDays = aMonDays[sTm.tm_mon % 12 ];
		if( sTm.tm_mon == 1 /* 'February' */ && !IS_LEAP_YEAR(sTm.tm_year) ){
			nDays = 28;
		}
		iVal = nDays;
		break;
			 }
	case 'U':
		/*Seconds since the Unix Epoch*/
		iVal = (jx9_int64)time(0);
		break;
	case 'w':
		/*	Day of the week (0 on Sunday) */
		iVal = sTm.tm_wday;
		break;
	case 'W': {
		/* ISO-8601 week number of year, weeks starting on Monday */
		static const int aISO8601[] = { 7 /* Sunday */, 1 /* Monday */, 2, 3, 4, 5, 6 };
		iVal = aISO8601[sTm.tm_wday % 7 ];
		break;
			  }
	case 'y':
		/* Year (2 digits) */
		iVal = sTm.tm_year % 100;
		break;
	case 'Y':
		/* Year (4 digits) */
		iVal = sTm.tm_year;
		break;
	case 'z':
		/* Day of the year */
		iVal = sTm.tm_yday;
		break;
	case 'Z':
		/*Timezone offset in seconds*/
		iVal = sTm.tm_gmtoff;
		break;
	default:
		/* unknown format, throw a warning */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Unknown date format token");
		break;
	}
	/* Return the time value */
	jx9_result_int64(pCtx, iVal);
	return JX9_OK;
}